

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgen.c
# Opt level: O1

int strip_comments(char *line)

{
  char *pcVar1;
  char *pcVar2;
  byte bVar3;
  
  bVar3 = strip_comments_in_comment;
  do {
    if ((bVar3 & 1) == 0) {
      pcVar2 = strchr(line,0x2d);
      if ((pcVar2 != (char *)0x0) && (pcVar2[1] == '-')) {
LAB_00104382:
        *pcVar2 = '\0';
        return 0;
      }
      pcVar2 = strchr(line,0x7b);
      if (pcVar2 == (char *)0x0) {
        return 0;
      }
      strip_comments_in_comment = 1;
      *pcVar2 = ' ';
    }
    else {
      pcVar1 = strchr(line,0x7d);
      pcVar2 = line;
      if (pcVar1 == (char *)0x0) goto LAB_00104382;
      strcpy(line,pcVar1 + 1);
      strip_comments_in_comment = 0;
    }
    bVar3 = bVar3 ^ 1;
  } while( true );
}

Assistant:

int
strip_comments(char *line)
{
    static int in_comment = 0;
    char *cp1, *cp2;

    cp1 = line;
    
    while (1)   /* traverse the entire string */
        {
        if (in_comment)
            {
            if ((cp2 = strchr(cp1, '}')) != NULL) /* comment ends */
                {
                strcpy(cp1, cp2 + 1);
                in_comment = 0;
                continue;
                }
            else 
                {
                *cp1 = '\0';
                break;
                }
            }
        else    /* not in_comment */
            {
            if ((cp2 = strchr(cp1, '-')) != NULL)
                {
                if (*(cp2 + 1) == '-')  /* found a '--' comment */
                    {
                    *cp2 = '\0';
                    break;
                    }
                }
            if ((cp2 = strchr(cp1, '{')) != NULL) /* comment starts */
                {
                in_comment = 1;
                *cp2 = ' ';
                continue;
                }
            else break;
            }
        }
    return(0);
}